

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qutil.cc
# Opt level: O2

void string_conversion_test(void)

{
  int iVar1;
  ostream *poVar2;
  char *pcVar3;
  undefined1 trim_trailing_zeroes;
  int length;
  undefined8 in_RCX;
  char *pcVar4;
  char *pcVar5;
  int in_R8D;
  string embedded_null;
  string int_max_str;
  string int_min_str;
  string small_negative;
  string small_positive;
  string int_min_minus_1_str;
  string int_max_plus_1_str;
  unique_ptr<char[],_std::default_delete<char[]>_> tmp3;
  shared_ptr<char> tmp2;
  string local_178;
  string local_158;
  string local_138;
  string local_118;
  string local_f8;
  string local_d8;
  string local_b8;
  string local_98;
  string local_78;
  string local_58;
  string local_38;
  
  std::locale::locale((locale *)&int_max_str,"en_US.UTF-8");
  std::locale::global((locale *)&embedded_null);
  std::locale::~locale((locale *)&embedded_null);
  std::locale::~locale((locale *)&int_max_str);
  QUtil::int_to_string_abi_cxx11_(&embedded_null,(QUtil *)0x3ebb,0,(int)in_RCX);
  poVar2 = std::operator<<((ostream *)&std::cout,(string *)&embedded_null);
  poVar2 = std::endl<char,std::char_traits<char>>(poVar2);
  QUtil::int_to_string_abi_cxx11_(&int_max_str,(QUtil *)0x3ebb,7,(int)in_RCX);
  poVar2 = std::operator<<(poVar2,(string *)&int_max_str);
  poVar2 = std::endl<char,std::char_traits<char>>(poVar2);
  QUtil::int_to_string_abi_cxx11_(&int_min_str,(QUtil *)0x3ebb,-7,(int)in_RCX);
  trim_trailing_zeroes = (undefined1)in_RCX;
  poVar2 = std::operator<<(poVar2,(string *)&int_min_str);
  poVar2 = std::endl<char,std::char_traits<char>>(poVar2);
  QUtil::double_to_string_abi_cxx11_
            (&int_max_plus_1_str,(QUtil *)0x0,3.14159,0,(bool)trim_trailing_zeroes);
  poVar2 = std::operator<<(poVar2,(string *)&int_max_plus_1_str);
  poVar2 = std::endl<char,std::char_traits<char>>(poVar2);
  QUtil::double_to_string_abi_cxx11_
            (&int_min_minus_1_str,(QUtil *)0x3,3.14159,1,(bool)trim_trailing_zeroes);
  poVar2 = std::operator<<(poVar2,(string *)&int_min_minus_1_str);
  poVar2 = std::endl<char,std::char_traits<char>>(poVar2);
  QUtil::double_to_string_abi_cxx11_
            (&small_positive,(QUtil *)0xfffffc00,1000.123,0,(bool)trim_trailing_zeroes);
  poVar2 = std::operator<<(poVar2,(string *)&small_positive);
  poVar2 = std::endl<char,std::char_traits<char>>(poVar2);
  QUtil::double_to_string_abi_cxx11_
            (&small_negative,(QUtil *)0x5,0.1234,0,(bool)trim_trailing_zeroes);
  poVar2 = std::operator<<(poVar2,(string *)&small_negative);
  poVar2 = std::endl<char,std::char_traits<char>>(poVar2);
  QUtil::double_to_string_abi_cxx11_
            ((string *)&tmp2,(QUtil *)0x5,0.0001234,1,(bool)trim_trailing_zeroes);
  poVar2 = std::operator<<(poVar2,(string *)&tmp2);
  poVar2 = std::endl<char,std::char_traits<char>>(poVar2);
  QUtil::double_to_string_abi_cxx11_
            ((string *)&tmp3,(QUtil *)0x5,0.123456,1,(bool)trim_trailing_zeroes);
  poVar2 = std::operator<<(poVar2,(string *)&tmp3);
  poVar2 = std::endl<char,std::char_traits<char>>(poVar2);
  QUtil::double_to_string_abi_cxx11_
            (&local_38,(QUtil *)0x5,0.000123456,1,(bool)trim_trailing_zeroes);
  poVar2 = std::operator<<(poVar2,(string *)&local_38);
  poVar2 = std::endl<char,std::char_traits<char>>(poVar2);
  QUtil::double_to_string_abi_cxx11_(&local_58,(QUtil *)0x5,1.0102,1,(bool)trim_trailing_zeroes);
  poVar2 = std::operator<<(poVar2,(string *)&local_58);
  poVar2 = std::endl<char,std::char_traits<char>>(poVar2);
  QUtil::double_to_string_abi_cxx11_(&local_78,(QUtil *)0x5,1.0,1,(bool)trim_trailing_zeroes);
  poVar2 = std::operator<<(poVar2,(string *)&local_78);
  poVar2 = std::endl<char,std::char_traits<char>>(poVar2);
  QUtil::double_to_string_abi_cxx11_(&local_98,(QUtil *)0x5,1.0,1,(bool)trim_trailing_zeroes);
  poVar2 = std::operator<<(poVar2,(string *)&local_98);
  poVar2 = std::endl<char,std::char_traits<char>>(poVar2);
  QUtil::double_to_string_abi_cxx11_(&local_b8,(QUtil *)0x5,1.0,0,(bool)trim_trailing_zeroes);
  poVar2 = std::operator<<(poVar2,(string *)&local_b8);
  poVar2 = std::endl<char,std::char_traits<char>>(poVar2);
  QUtil::double_to_string_abi_cxx11_(&local_d8,(QUtil *)0x2,10.0,0,(bool)trim_trailing_zeroes);
  poVar2 = std::operator<<(poVar2,(string *)&local_d8);
  poVar2 = std::endl<char,std::char_traits<char>>(poVar2);
  QUtil::double_to_string_abi_cxx11_(&local_f8,(QUtil *)0x2,10.0,1,(bool)trim_trailing_zeroes);
  poVar2 = std::operator<<(poVar2,(string *)&local_f8);
  poVar2 = std::endl<char,std::char_traits<char>>(poVar2);
  QUtil::int_to_string_base_abi_cxx11_(&local_118,(QUtil *)0x3ebb,10,0,in_R8D);
  poVar2 = std::operator<<(poVar2,(string *)&local_118);
  poVar2 = std::endl<char,std::char_traits<char>>(poVar2);
  QUtil::int_to_string_base_abi_cxx11_(&local_138,(QUtil *)0x3ebb,8,0,in_R8D);
  poVar2 = std::operator<<(poVar2,(string *)&local_138);
  poVar2 = std::endl<char,std::char_traits<char>>(poVar2);
  QUtil::int_to_string_base_abi_cxx11_(&local_158,(QUtil *)0x3ebb,0x10,0,in_R8D);
  poVar2 = std::operator<<(poVar2,(string *)&local_158);
  poVar2 = std::endl<char,std::char_traits<char>>(poVar2);
  length = 0;
  QUtil::int_to_string_base_abi_cxx11_(&local_178,(QUtil *)0x12a075f70,10,0,in_R8D);
  poVar2 = std::operator<<(poVar2,(string *)&local_178);
  std::endl<char,std::char_traits<char>>(poVar2);
  std::__cxx11::string::~string((string *)&local_178);
  std::__cxx11::string::~string((string *)&local_158);
  std::__cxx11::string::~string((string *)&local_138);
  std::__cxx11::string::~string((string *)&local_118);
  std::__cxx11::string::~string((string *)&local_f8);
  std::__cxx11::string::~string((string *)&local_d8);
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&tmp3);
  std::__cxx11::string::~string((string *)&tmp2);
  std::__cxx11::string::~string((string *)&small_negative);
  std::__cxx11::string::~string((string *)&small_positive);
  std::__cxx11::string::~string((string *)&int_min_minus_1_str);
  std::__cxx11::string::~string((string *)&int_max_plus_1_str);
  std::__cxx11::string::~string((string *)&int_min_str);
  std::__cxx11::string::~string((string *)&int_max_str);
  std::__cxx11::string::~string((string *)&embedded_null);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&embedded_null,"one",(allocator<char> *)&int_max_str);
  std::__cxx11::string::push_back((char)&embedded_null);
  std::__cxx11::string::append((char *)&embedded_null);
  poVar2 = std::operator<<((ostream *)&std::cout,embedded_null._M_dataplus._M_p);
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::endl<char,std::char_traits<char>>(poVar2);
  pcVar3 = QUtil::copy_string(&embedded_null);
  iVar1 = bcmp(pcVar3,embedded_null._M_dataplus._M_p,7);
  pcVar4 = "compare failed";
  pcVar5 = "compare failed";
  if (iVar1 == 0) {
    pcVar5 = "compare okay";
  }
  poVar2 = std::operator<<((ostream *)&std::cout,pcVar5);
  std::endl<char,std::char_traits<char>>(poVar2);
  if (pcVar3 != (char *)0x0) {
    operator_delete__(pcVar3);
  }
  QUtil::make_shared_cstr((QUtil *)&tmp2,&embedded_null);
  iVar1 = bcmp(tmp2.super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
               embedded_null._M_dataplus._M_p,7);
  pcVar3 = "compare failed";
  if (iVar1 == 0) {
    pcVar3 = "compare okay";
  }
  poVar2 = std::operator<<((ostream *)&std::cout,pcVar3);
  std::endl<char,std::char_traits<char>>(poVar2);
  QUtil::make_unique_cstr((QUtil *)&tmp3,&embedded_null);
  iVar1 = bcmp((void *)tmp3._M_t.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
                       super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
                       super__Head_base<0UL,_char_*,_false>._M_head_impl,
               embedded_null._M_dataplus._M_p,7);
  if (iVar1 == 0) {
    pcVar4 = "compare okay";
  }
  poVar2 = std::operator<<((ostream *)&std::cout,pcVar4);
  std::endl<char,std::char_traits<char>>(poVar2);
  QUtil::int_to_string_abi_cxx11_(&int_max_str,(QUtil *)0x7fffffff,0,length);
  QUtil::int_to_string_abi_cxx11_(&int_min_str,(QUtil *)0xffffffff80000000,0,length);
  QUtil::int_to_string_abi_cxx11_(&int_max_plus_1_str,(QUtil *)0x80000000,0,length);
  QUtil::int_to_string_abi_cxx11_(&int_min_minus_1_str,(QUtil *)0xffffffff7fffffff,0,length);
  QUtil::uint_to_string_abi_cxx11_(&small_positive,(QUtil *)0x3ebb,0,length);
  QUtil::int_to_string_abi_cxx11_(&small_negative,(QUtil *)0xffffffffffffc145,0,length);
  test_to_int(int_min_str._M_dataplus._M_p,-0x80000000,false);
  test_to_int(int_max_str._M_dataplus._M_p,0x7fffffff,false);
  test_to_int(int_max_plus_1_str._M_dataplus._M_p,0,true);
  test_to_int(int_min_minus_1_str._M_dataplus._M_p,0,true);
  test_to_int("9999999999999999999999999",0,true);
  test_to_ll(int_max_plus_1_str._M_dataplus._M_p,0x80000000,false);
  test_to_ll(int_min_minus_1_str._M_dataplus._M_p,-0x80000001,false);
  test_to_ll("99999999999999999999999999999999999999999999999999",0,true);
  test_to_uint(small_positive._M_dataplus._M_p,0x3ebb,false);
  test_to_uint(small_negative._M_dataplus._M_p,0,true);
  test_to_uint("9999999999",0,true);
  test_to_ull(small_positive._M_dataplus._M_p,0x3ebb,false);
  test_to_ull(small_negative._M_dataplus._M_p,0,true);
  std::__cxx11::string::~string((string *)&small_negative);
  std::__cxx11::string::~string((string *)&small_positive);
  std::__cxx11::string::~string((string *)&int_min_minus_1_str);
  std::__cxx11::string::~string((string *)&int_max_plus_1_str);
  std::__cxx11::string::~string((string *)&int_min_str);
  std::__cxx11::string::~string((string *)&int_max_str);
  std::unique_ptr<char[],_std::default_delete<char[]>_>::~unique_ptr(&tmp3);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&tmp2.super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__cxx11::string::~string((string *)&embedded_null);
  return;
}

Assistant:

static void
set_locale()
{
    try {
        // First try a locale known to put commas in numbers.
        std::locale::global(std::locale("en_US.UTF-8"));
    } catch (std::runtime_error&) {
        try {
            // If that fails, fall back to the user's default locale.
            std::locale::global(std::locale(""));
        } catch (std::runtime_error& e) {
            // Ignore this error on Windows without MSVC. We get
            // enough test coverage on other platforms, and mingw
            // seems to have limited locale support (as of
            // 2020-10).
#if !defined(_WIN32) || defined(_MSC_VER)
            throw e;
#endif
        }
    }
}